

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGraphGenerator.cpp
# Opt level: O3

bool __thiscall
ADS::RandomGraphGenerator::addEdges
          (RandomGraphGenerator *this,Graph<unsigned_int> *pGraph,uint uiNVerteces,uint uiNEdges)

{
  bool bVar1;
  uint uVar2;
  uint uiSrcKey;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  
  if (pGraph != (Graph<unsigned_int> *)0x0) {
    uVar2 = pGraph->_uiNEdges;
    while (uVar2 < uiNEdges) {
      random((ADS *)(ulong)uiNVerteces);
      random((ADS *)(ulong)uiNVerteces);
      uiSrcKey = (uint)(long)extraout_XMM0_Da;
      uVar2 = (uint)(long)extraout_XMM0_Da_00;
      if (uiSrcKey != uVar2) {
        random();
        bVar1 = Graph<unsigned_int>::hasEdge(pGraph,uiSrcKey,uVar2);
        if (!bVar1) {
          Graph<unsigned_int>::addEdge(pGraph,uiSrcKey,uVar2,(uint)(long)extraout_XMM0_Da_01);
        }
      }
      uVar2 = pGraph->_uiNEdges;
    }
  }
  return pGraph != (Graph<unsigned_int> *)0x0;
}

Assistant:

bool RandomGraphGenerator::addEdges (Graph<unsigned int> *pGraph,
                                     unsigned int uiNVerteces,
                                     unsigned int uiNEdges)
{
    if (pGraph == NULL)
        return false;

    while (pGraph->getEdgeCount() < uiNEdges) {
        unsigned int uiSrc = static_cast<unsigned int>(random (uiNVerteces));
        unsigned int uiDst = static_cast<unsigned int>(random (uiNVerteces));
        
        if (uiSrc == uiDst) {
            /* do not add edges to itself */
            continue;
        }

        unsigned int uiCost = random (EDGE_MIN_COST, EDGE_MAX_COST);

        if (!pGraph->hasEdge (uiSrc, uiDst))
            pGraph-> addEdge (uiSrc, uiDst, uiCost);
    }

    return true;
}